

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O1

void __thiscall max_flow_algo::discharge(max_flow_algo *this,NodeID node)

{
  int level;
  pointer pvVar1;
  pointer piVar2;
  ulong uVar3;
  
  pvVar1 = (this->adj->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar2 = pvVar1[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar1[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar2) {
    uVar3 = 0;
    do {
      if ((this->m_excess).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[node] < 1) break;
      if ((this->active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[piVar2[uVar3]] < 0) {
        push(this,node,piVar2[uVar3],(int)uVar3);
      }
      uVar3 = uVar3 + 1;
      pvVar1 = (this->adj->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar2 = pvVar1[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar1[node].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + 8) - (long)piVar2 >> 2));
  }
  if ((this->m_excess).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[node] < 1) {
    return;
  }
  level = (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[node];
  if (((this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[level] == 1) && (level < this->rn)) {
    gap_heuristic(this,level);
    return;
  }
  relabel(this,node);
  return;
}

Assistant:

void discharge(NodeID node)
    {

        for (int i = 0; i < adj[node].size() && m_excess[node] > 0; i++)
        {
            NodeID target = adj[node][i];
            if (isActive(target))
                push(node, target, i);
        }

        if (m_excess[node] > 0)
        {
            if (m_count[m_distance[node]] == 1 && m_distance[node] < rn)
            {
                // hence this layer will be empty after the relabel step
                gap_heuristic(m_distance[node]);
            }
            else
            {
                relabel(node);
            }
        }
    }